

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::compressFaces(SurfaceMesh *this)

{
  pointer puVar1;
  size_type __new_size;
  size_t *x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pointer puVar3;
  _List_node_base *p_Var4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newBLIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  unsigned_long local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  pvVar2 = &local_a8;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,this->nFacesCapacityCount,&INVALID_IND,(allocator_type *)&local_a8);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = (pointer)this->nFacesCapacityCount;
  if (puVar3 != (pointer)0x0) {
    do {
      puVar1 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (pointer)((long)puVar3 - this->nBoundaryLoopsFillCount);
      if (((local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start < (pointer)this->nFacesFillCount) ||
          (puVar3 <= local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start)) &&
         ((this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [(long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start] != 0xffffffffffffffff)) {
        (&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data._M_start)
        [(long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start] =
             (pointer)((long)local_88.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
        pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
        }
        else {
          *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (puVar3 <= puVar1) {
          local_50 = ~(ulong)local_a8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + this->nFacesCapacityCount;
          if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_50;
            local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
      puVar3 = (pointer)this->nFacesCapacityCount;
    } while (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start < puVar3);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (&local_a8,(geometrycentral *)&this->fHalfedgeArr,&local_88,pvVar2);
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  puVar1 = (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0xffffffffffffffff) {
      *puVar3 = (unsigned_long)
                (&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                  _M_start)[*puVar3];
    }
  }
  __new_size = this->nFacesCount;
  this->nFacesFillCount = __new_size;
  this->nFacesCapacityCount = this->nBoundaryLoopsCount + __new_size;
  this->nBoundaryLoopsFillCount = this->nBoundaryLoopsCount;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_88,__new_size);
  p_Var4 = (_List_node_base *)&this->facePermuteCallbackList;
  while( true ) {
    p_Var4 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->facePermuteCallbackList) {
      p_Var4 = (_List_node_base *)&this->boundaryLoopPermuteCallbackList;
      while( true ) {
        p_Var4 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                    *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)&this->boundaryLoopPermuteCallbackList) {
          if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        if (p_Var4[2]._M_next == (_List_node_base *)0x0) break;
        (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_68);
      }
      ::std::__throw_bad_function_call();
    }
    if (p_Var4[2]._M_next == (_List_node_base *)0x0) break;
    (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_88);
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void SurfaceMesh::compressFaces() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newBLIndMap;                                 // maps BL new ind -> old ind
  std::vector<size_t> oldIndMap(nFacesCapacityCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nFacesCapacityCount; i++) {
    bool isBL = (i >= nFacesCapacityCount - nBoundaryLoopsFillCount);
    if (i < nFacesFillCount || isBL) { // skip gap between faces and BLs
      if (!faceIsDead(i)) {
        oldIndMap[i] = newIndMap.size();
        newIndMap.push_back(i);

        if (isBL) {
          newBLIndMap.push_back(faceIndToBoundaryLoopInd(i));
        }
      }
    }
  }


  // Permute & resize all per-face arrays
  fHalfedgeArr = applyPermutation(fHalfedgeArr, newIndMap);

  // Update indices in all face-valued arrays
  updateValues(heFaceArr, oldIndMap);

  // Update counts
  nFacesFillCount = nFacesCount;
  nFacesCapacityCount = nFacesCount + nBoundaryLoopsCount;
  nBoundaryLoopsFillCount = nBoundaryLoopsCount;

  // Invoke callbacks
  newIndMap.resize(nFacesCount); // truncate all boundary loop entries, so this array now just holds values for faces
  for (auto& f : facePermuteCallbackList) {
    f(newIndMap);
  }
  for (auto& f : boundaryLoopPermuteCallbackList) {
    f(newBLIndMap);
  }
}